

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

path * create_out_folder(path *__return_storage_ptr__,string *st)

{
  pointer pcVar1;
  char cVar2;
  uint in_EAX;
  Error *this;
  uint local_28;
  
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  pcVar1 = (st->_M_dataplus)._M_p;
  local_28 = in_EAX;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + st->_M_string_length);
  boost::filesystem::detail::status((path *)&local_28,(error_code *)__return_storage_ptr__);
  if (local_28 < 2) {
    cVar2 = boost::filesystem::detail::create_directory
                      (__return_storage_ptr__,(path *)0x0,(error_code *)0x0);
    if (cVar2 == '\0') {
      this = (Error *)__cxa_allocate_exception(0x3f0);
      Error::Error(this,"Could not create output dir %s",(st->_M_dataplus)._M_p);
      __cxa_throw(this,&Error::typeinfo,std::exception::~exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path create_out_folder(std::string st) {
  path p(st);
  if (!exists(p) && !create_directory(p)) {
    throw Error("Could not create output dir %s", &st[0]);
  }
  return p;
}